

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGhsMultiTargetGenerator.cxx
# Opt level: O3

void __thiscall
cmGhsMultiTargetGenerator::WriteCustomCommandsHelper
          (cmGhsMultiTargetGenerator *this,ostream *fout,cmCustomCommandGenerator *ccg)

{
  pointer pcVar1;
  pointer pbVar2;
  uint uVar3;
  string *psVar4;
  char *__s;
  long *plVar5;
  long lVar6;
  long lVar7;
  ostream *poVar8;
  size_t *psVar9;
  char cVar10;
  uint c_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *c;
  pointer pbVar11;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  string_view source;
  string_view source_00;
  string dir;
  string cmd;
  string check_error;
  string cdCmd;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  cmdLines;
  string cdStr;
  string workingDir;
  long *local_160;
  size_t local_158;
  long local_150 [2];
  string local_140;
  string local_120;
  long *local_100;
  long local_f8;
  long local_f0 [2];
  cmGhsMultiTargetGenerator *local_e0;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  long *local_98 [2];
  long local_88 [2];
  ostream *local_78;
  string local_70;
  string local_50;
  
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = this;
  local_78 = fout;
  psVar4 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_
                     (&this->LocalGenerator->super_cmLocalGenerator);
  local_160 = local_150;
  pcVar1 = (psVar4->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_160,pcVar1,pcVar1 + psVar4->_M_string_length);
  cmCustomCommandGenerator::GetWorkingDirectory_abi_cxx11_(&local_70,ccg);
  if (local_70._M_string_length != 0) {
    std::__cxx11::string::_M_assign((string *)&local_160);
  }
  local_100 = local_f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"if [ $? -ne 0 ]; then exit 1; fi","");
  __s = cmCustomCommandGenerator::GetComment(ccg);
  if ((__s != (char *)0x0) && (*__s != '\0')) {
    local_140.field_2._M_allocated_capacity = strlen(__s);
    local_140._M_dataplus._M_p = (pointer)0x5;
    local_140._M_string_length = 0x7c962c;
    views._M_len = 2;
    views._M_array = (iterator)&local_140;
    local_140.field_2._8_8_ = __s;
    cmCatViews_abi_cxx11_(&local_d8,views);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
               &local_d8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p,
                      CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                               local_d8.field_2._M_local_buf[0]) + 1);
    }
  }
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  local_d8._M_string_length = 0;
  local_d8.field_2._M_local_buf[0] = '\0';
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"cd ","");
  source._M_str = (char *)local_160;
  source._M_len = local_158;
  cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
            (&local_120,&(local_e0->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
             source,SHELL);
  plVar5 = (long *)std::__cxx11::string::replace((ulong)&local_120,0,(char *)0x0,(ulong)local_98[0])
  ;
  psVar9 = (size_t *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar9) {
    local_140.field_2._M_allocated_capacity = *psVar9;
    local_140.field_2._8_8_ = plVar5[3];
    local_140._M_dataplus._M_p = (pointer)&local_140.field_2;
  }
  else {
    local_140.field_2._M_allocated_capacity = *psVar9;
    local_140._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_140._M_string_length = plVar5[1];
  *plVar5 = (long)psVar9;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_d8,(string *)&local_140);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != &local_140.field_2) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != &local_120.field_2) {
    operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
  }
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
             &local_d8);
  c_00 = 0;
  while( true ) {
    uVar3 = cmCustomCommandGenerator::GetNumberOfCommands(ccg);
    pbVar2 = local_b8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (uVar3 <= c_00) break;
    cmCustomCommandGenerator::GetCommand_abi_cxx11_(&local_120,ccg,c_00);
    if (local_120._M_string_length != 0) {
      cmsys::SystemTools::ReplaceString(&local_120,"/./","/");
      cVar10 = (char)&local_120;
      lVar6 = std::__cxx11::string::find(cVar10,0x2f);
      if (local_70._M_string_length == 0) {
        cmOutputConverter::MaybeRelativeToCurBinDir
                  (&local_140,
                   &(local_e0->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                   &local_120);
        std::__cxx11::string::operator=((string *)&local_120,(string *)&local_140);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_140._M_dataplus._M_p != &local_140.field_2) {
          operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
        }
      }
      lVar7 = std::__cxx11::string::find(cVar10,0x2f);
      if ((lVar6 != -1) && (lVar7 == -1)) {
        local_140._M_dataplus._M_p = (pointer)0x2;
        local_140._M_string_length = 0x7dd606;
        local_140.field_2._M_allocated_capacity = local_120._M_string_length;
        local_140.field_2._8_8_ = local_120._M_dataplus._M_p;
        views_00._M_len = 2;
        views_00._M_array = (iterator)&local_140;
        cmCatViews_abi_cxx11_(&local_50,views_00);
        std::__cxx11::string::operator=((string *)&local_120,(string *)&local_50);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
      }
      source_00._M_str = local_120._M_dataplus._M_p;
      source_00._M_len = local_120._M_string_length;
      cmOutputConverter::ConvertToOutputFormat_abi_cxx11_
                (&local_140,
                 &(local_e0->LocalGenerator->super_cmLocalGenerator).super_cmOutputConverter,
                 source_00,SHELL);
      std::__cxx11::string::operator=((string *)&local_120,(string *)&local_140);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_140._M_dataplus._M_p != &local_140.field_2) {
        operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
      }
      cmCustomCommandGenerator::AppendArguments(ccg,c_00,&local_120);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_b8,
                 &local_120);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p,local_120.field_2._M_allocated_capacity + 1);
    }
    c_00 = c_00 + 1;
  }
  if (local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar11 = local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_78,(pbVar11->_M_dataplus)._M_p,pbVar11->_M_string_length);
      local_140._M_dataplus._M_p._0_1_ = 10;
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_140,1);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_100,local_f8)
      ;
      local_140._M_dataplus._M_p._0_1_ = 10;
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)&local_140,1);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar2);
  }
  if (local_98[0] != local_88) {
    operator_delete(local_98[0],local_88[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,
                    CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                             local_d8.field_2._M_local_buf[0]) + 1);
  }
  if (local_100 != local_f0) {
    operator_delete(local_100,local_f0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (local_160 != local_150) {
    operator_delete(local_160,local_150[0] + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b8);
  return;
}

Assistant:

void cmGhsMultiTargetGenerator::WriteCustomCommandsHelper(
  std::ostream& fout, cmCustomCommandGenerator const& ccg)
{
  std::vector<std::string> cmdLines;

  // if the command specified a working directory use it.
  std::string dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  std::string workingDir = ccg.GetWorkingDirectory();
  if (!workingDir.empty()) {
    dir = workingDir;
  }

  // Line to check for error between commands.
#ifdef _WIN32
  std::string check_error = "if %errorlevel% neq 0 exit /b %errorlevel%";
#else
  std::string check_error = "if [ $? -ne 0 ]; then exit 1; fi";
#endif

#ifdef _WIN32
  cmdLines.push_back("@echo off");
#endif
  // Echo the custom command's comment text.
  const char* comment = ccg.GetComment();
  if (comment && *comment) {
    std::string echocmd = cmStrCat("echo ", comment);
    cmdLines.push_back(std::move(echocmd));
  }

  // Switch to working directory
  std::string cdCmd;
#ifdef _WIN32
  std::string cdStr = "cd /D ";
#else
  std::string cdStr = "cd ";
#endif
  cdCmd = cdStr +
    this->LocalGenerator->ConvertToOutputFormat(dir, cmOutputConverter::SHELL);
  cmdLines.push_back(std::move(cdCmd));

  for (unsigned int c = 0; c < ccg.GetNumberOfCommands(); ++c) {
    // Build the command line in a single string.
    std::string cmd = ccg.GetCommand(c);
    if (!cmd.empty()) {
      // Use "call " before any invocations of .bat or .cmd files
      // invoked as custom commands in the WindowsShell.
      //
      bool useCall = false;

#ifdef _WIN32
      std::string suffix;
      if (cmd.size() > 4) {
        suffix = cmSystemTools::LowerCase(cmd.substr(cmd.size() - 4));
        if (suffix == ".bat" || suffix == ".cmd") {
          useCall = true;
        }
      }
#endif

      cmSystemTools::ReplaceString(cmd, "/./", "/");
      // Convert the command to a relative path only if the current
      // working directory will be the start-output directory.
      bool had_slash = cmd.find('/') != std::string::npos;
      if (workingDir.empty()) {
        cmd = this->LocalGenerator->MaybeRelativeToCurBinDir(cmd);
      }
      bool has_slash = cmd.find('/') != std::string::npos;
      if (had_slash && !has_slash) {
        // This command was specified as a path to a file in the
        // current directory.  Add a leading "./" so it can run
        // without the current directory being in the search path.
        cmd = cmStrCat("./", cmd);
      }
      cmd = this->LocalGenerator->ConvertToOutputFormat(
        cmd, cmOutputConverter::SHELL);
      if (useCall) {
        cmd = cmStrCat("call ", cmd);
      }
      ccg.AppendArguments(c, cmd);
      cmdLines.push_back(std::move(cmd));
    }
  }

  // push back the custom commands
  for (auto const& c : cmdLines) {
    fout << c << '\n' << check_error << '\n';
  }
}